

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

void coda_get_uint64set(char *str,
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *result)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RSI;
  value_type_conflict *in_RDI;
  uint64_t temp;
  char *i;
  undefined1 local_20 [8];
  
  while (in_RDI != (value_type_conflict *)0x0) {
    __isoc99_sscanf(in_RDI,"%lu",local_20);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              (in_RSI,in_RDI);
    in_RDI = (value_type_conflict *)strchr((char *)in_RDI,0x2c);
    if (in_RDI != (value_type_conflict *)0x0) {
      in_RDI = (value_type_conflict *)((long)in_RDI + 1);
    }
  }
  return;
}

Assistant:

void coda_get_uint64set(const char* str, std::set<uint64_t>& result)
{
	const char* i = str;
	while (i)
	{
		uint64_t temp;
		sscanf(i, "%" PRIu64, &temp);
		result.insert(temp);
		i = strchr(i, ',');
		if (i)
		{
			++i;
		}
	}
}